

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall duckdb::ColumnData::CommitDropColumn(ColumnData *this)

{
  __pointer_type this_00;
  ColumnSegment *segment_p;
  
  for (this_00 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                           (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>);
      this_00 != (ColumnSegment *)0x0;
      this_00 = (this_00->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
    ColumnSegment::CommitDropSegment(this_00);
  }
  return;
}

Assistant:

void ColumnData::CommitDropColumn() {
	for (auto &segment_p : data.Segments()) {
		auto &segment = segment_p;
		segment.CommitDropSegment();
	}
}